

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O3

bool __thiscall chrono::ChOptimizer::Optimize(ChOptimizer *this)

{
  int iVar1;
  
  iVar1 = (*this->_vptr_ChOptimizer[8])();
  if ((char)iVar1 != '\0') {
    iVar1 = (*this->_vptr_ChOptimizer[9])(this);
    if ((char)iVar1 != '\0') {
      iVar1 = (*this->_vptr_ChOptimizer[10])(this);
      return SUB41(iVar1,0);
    }
  }
  return false;
}

Assistant:

bool ChOptimizer::Optimize() {
    if (!PreOptimize())
        return false;  // 1-
    if (!DoOptimize())
        return false;  // 2-
    if (!PostOptimize())
        return false;  // 3-
    return true;
}